

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O0

void __thiscall t_html_generator::generate_const(t_html_generator *this,t_const *tconst)

{
  bool bVar1;
  ostream *poVar2;
  t_type *ptVar3;
  t_const_value *tvalue;
  undefined1 local_38 [8];
  string name;
  t_const *tconst_local;
  t_html_generator *this_local;
  
  name.field_2._8_8_ = tconst;
  t_const::get_name_abi_cxx11_((string *)local_38,tconst);
  poVar2 = std::operator<<((ostream *)&this->f_out_,"<tr id=\"Const_");
  poVar2 = std::operator<<(poVar2,(string *)local_38);
  poVar2 = std::operator<<(poVar2,"\"><td><code>");
  poVar2 = std::operator<<(poVar2,(string *)local_38);
  std::operator<<(poVar2,"</code></td><td>");
  ptVar3 = t_const::get_type((t_const *)name.field_2._8_8_);
  print_type(this,ptVar3);
  std::operator<<((ostream *)&this->f_out_,"</td><td><code>");
  ptVar3 = t_const::get_type((t_const *)name.field_2._8_8_);
  tvalue = t_const::get_value((t_const *)name.field_2._8_8_);
  print_const_value(this,ptVar3,tvalue);
  std::operator<<((ostream *)&this->f_out_,"</code></td></tr>");
  bVar1 = t_doc::has_doc((t_doc *)name.field_2._8_8_);
  if (bVar1) {
    std::operator<<((ostream *)&this->f_out_,"<tr><td colspan=\"3\"><blockquote>");
    print_doc(this,(t_doc *)name.field_2._8_8_);
    std::operator<<((ostream *)&this->f_out_,"</blockquote></td></tr>");
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_html_generator::generate_const(t_const* tconst) {
  string name = tconst->get_name();
  f_out_ << "<tr id=\"Const_" << name << "\"><td><code>" << name << "</code></td><td>";
  print_type(tconst->get_type());
  f_out_ << "</td><td><code>";
  print_const_value(tconst->get_type(), tconst->get_value());
  f_out_ << "</code></td></tr>";
  if (tconst->has_doc()) {
    f_out_ << "<tr><td colspan=\"3\"><blockquote>";
    print_doc(tconst);
    f_out_ << "</blockquote></td></tr>";
  }
}